

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_bdecode.cpp
# Opt level: O0

string * __thiscall
libtorrent::lazy_entry::dict_find_string_value_abi_cxx11_
          (string *__return_storage_ptr__,lazy_entry *this,char *name)

{
  entry_type_t eVar1;
  lazy_entry *this_00;
  lazy_entry *e;
  char *name_local;
  lazy_entry *this_local;
  
  this_00 = dict_find(this,name);
  if ((this_00 != (lazy_entry *)0x0) && (eVar1 = type(this_00), eVar1 == string_t)) {
    string_value_abi_cxx11_(__return_storage_ptr__,this_00);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string lazy_entry::dict_find_string_value(char const* name) const
	{
		lazy_entry const* e = dict_find(name);
		if (e == nullptr || e->type() != lazy_entry::string_t) return std::string();
		return e->string_value();
	}